

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void * PAL_LoadLibraryDirect(LPCWSTR lpLibFileName)

{
  bool bVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  void *local_70;
  void *dl_handle;
  char *pcStack_60;
  INT name_length;
  CHAR *lpstr;
  LPCWSTR lpLibFileName_local;
  PathCharString pathstr;
  
  pathstr.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  lpstr = (CHAR *)lpLibFileName;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpLibFileName_local);
  pcStack_60 = (char *)0x0;
  local_70 = (void *)0x0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  bVar1 = LOADVerifyLibraryPath<char16_t>((char16_t *)lpstr);
  if (bVar1) {
    sVar2 = PAL_wcslen((char16_t *)lpstr);
    pcStack_60 = StackString<32UL,_char>::OpenStringBuffer
                           ((StackString<32UL,_char> *)&lpLibFileName_local,
                            (sVar2 + 1) * (long)MaxWCharToAcpLength);
    if ((pcStack_60 != (char *)0x0) &&
       (bVar1 = LOADConvertLibraryPathWideStringToMultibyteString
                          ((LPCWSTR)lpstr,pcStack_60,(INT *)((long)&dl_handle + 4)), bVar1)) {
      FILEDosToUnixPathA(pcStack_60);
      StackString<32UL,_char>::CloseBuffer
                ((StackString<32UL,_char> *)&lpLibFileName_local,(long)dl_handle._4_4_);
      local_70 = LOADLoadLibraryDirect(pcStack_60);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpLibFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != pathstr.m_count) {
      __stack_chk_fail();
    }
    return local_70;
  }
  abort();
}

Assistant:

void *
PALAPI
PAL_LoadLibraryDirect(
    IN LPCWSTR lpLibFileName)
{
    PathCharString pathstr;
    CHAR * lpstr = nullptr;
    INT name_length;
    void *dl_handle = nullptr;

    PERF_ENTRY(LoadLibraryDirect);
    ENTRY("LoadLibraryDirect (lpLibFileName=%p (%S)) \n",
          lpLibFileName ? lpLibFileName : W16_NULLSTRING,
          lpLibFileName ? lpLibFileName : W16_NULLSTRING);

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto done;
    }

    lpstr = pathstr.OpenStringBuffer((PAL_wcslen(lpLibFileName)+1) * MaxWCharToAcpLength);
    if (nullptr == lpstr)
    {
        goto done;
    }
    if (!LOADConvertLibraryPathWideStringToMultibyteString(lpLibFileName, lpstr, &name_length))
    {
        goto done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    FILEDosToUnixPathA(lpstr);
    pathstr.CloseBuffer(name_length);

    dl_handle = LOADLoadLibraryDirect(lpstr);

done:
    LOGEXIT("LoadLibraryDirect returns HMODULE %p\n", dl_handle);
    PERF_EXIT(LoadLibraryDirect);
    return dl_handle;
}